

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O0

void __thiscall calculator::Reader::set_buffer(Reader *this,string *s)

{
  int iVar1;
  char *pcVar2;
  void *__src;
  ulong uVar3;
  string *s_local;
  Reader *this_local;
  
  if (this->sbuffer_ != (char *)0x0) {
    if (this->sbuffer_ != (char *)0x0) {
      operator_delete__(this->sbuffer_);
    }
    this->sbuffer_ = (char *)0x0;
  }
  iVar1 = std::__cxx11::string::length();
  this->len_ = iVar1;
  this->ptr_ = -1;
  uVar3 = (ulong)this->len_;
  if (uVar3 == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pcVar2 = (char *)operator_new__(uVar3);
  *pcVar2 = '\0';
  memset(pcVar2 + 1,0,uVar3 - 1);
  this->sbuffer_ = pcVar2;
  pcVar2 = this->sbuffer_;
  __src = (void *)std::__cxx11::string::data();
  memcpy(pcVar2,__src,(long)this->len_);
  return;
}

Assistant:

void set_buffer(const std::string& s) {
        if (sbuffer_) {
            delete[] sbuffer_;
            sbuffer_ = nullptr;
        }
        len_ = (int)s.length();
        ptr_ = -1;
        sbuffer_ = new char[len_]{0};
        memcpy(sbuffer_, s.data(), len_ * sizeof(char));
    }